

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

int xmllintMain(int argc,char **argv,FILE *errStream,xmlResourceLoader loader)

{
  int iVar1;
  char *pcVar2;
  undefined8 *puVar3;
  long lVar4;
  xmlSAXHandler *local_488;
  xmlSAXHandler *handler;
  xmlParserCtxtPtr ctxt_3;
  stat info;
  int memoryFd;
  char *filename;
  xmlSchemaParserCtxtPtr ctxt_2;
  xmlRelaxNGParserCtxtPtr ctxt_1;
  xmlSchematronParserCtxtPtr ctxt;
  char *indent;
  char *catal;
  int files;
  int res;
  int j;
  int i;
  xmllintState *lint;
  xmllintState state;
  xmlResourceLoader loader_local;
  FILE *errStream_local;
  char **argv_local;
  int argc_local;
  
  catal._0_4_ = 0;
  state.end._8_8_ = loader;
  xmllintInit((xmllintState *)&lint);
  state.ctxt = (xmlParserCtxtPtr)state.end._8_8_;
  lint = (xmllintState *)errStream;
  iVar1 = xmllintParseOptions((xmllintState *)&lint,argc,argv);
  if (iVar1 != 0) goto LAB_00106a85;
  if (state.defaultResourceLoader._4_4_ != 0) {
    xmllintMaxmem = 0;
    xmllintMaxmemReached = 0;
    xmllintOom = 0;
    xmlMemSetup(myFreeFunc,myMallocFunc,myReallocFunc,myStrdupFunc);
  }
  xmlCheckVersion(0x5398);
  if ((state.xpathquery._4_4_ == 0) && ((int)state.xpathquery != 0)) {
    pcVar2 = getenv("SGML_CATALOG_FILES");
    if (pcVar2 == (char *)0x0) {
      fprintf((FILE *)errStream,"Variable $SGML_CATALOG_FILES not set\n");
    }
    else {
      xmlLoadCatalogs(pcVar2);
    }
  }
  pcVar2 = getenv("XMLLINT_INDENT");
  if (pcVar2 != (char *)0x0) {
    puVar3 = (undefined8 *)__xmlTreeIndentString();
    *puVar3 = pcVar2;
  }
  if (state.html != 0) {
    state._824_8_ = (*_xmlMalloc)(50000);
    if (state._824_8_ == 0) {
      state.testIO = 9;
      iVar1 = state.testIO;
      goto LAB_00106a85;
    }
    if (state.version == 0) {
      fprintf((FILE *)errStream,"<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\"\n")
      ;
      fprintf((FILE *)errStream,"\t\"http://www.w3.org/TR/REC-html40/loose.dtd\">\n");
      fprintf((FILE *)errStream,"<html><head><title>%s output</title></head>\n",*argv);
      fprintf((FILE *)errStream,"<body bgcolor=\"#ffffff\"><h1 align=\"center\">%s output</h1>\n",
              *argv);
    }
  }
  if (((state.wxschemas != (xmlSchemaPtr)0x0) && (state.maxmem == 0)) && (state.canonical_11 == 0))
  {
    state.catalogs = state.catalogs | 4;
    if (state.progresult != XMLLINT_RETURN_OK) {
      startTimer((xmllintState *)&lint);
    }
    lVar4 = xmlSchematronNewParserCtxt(state.wxschemas);
    if (lVar4 == 0) {
      state.testIO = 9;
      iVar1 = state.testIO;
      goto LAB_00106a85;
    }
    state.schematron = (char *)xmlSchematronParse(lVar4);
    if (state.schematron == (char *)0x0) {
      fprintf((FILE *)errStream,"Schematron schema %s failed to compile\n",state.wxschemas);
      state.testIO = 5;
      iVar1 = state.testIO;
      goto LAB_00106a85;
    }
    xmlSchematronFreeParserCtxt(lVar4);
    if (state.progresult != XMLLINT_RETURN_OK) {
      endTimer((xmllintState *)&lint,"Compiling the schemas");
    }
  }
  if (((state._112_8_ == 0) || (state.maxmem != 0)) || (state.canonical_11 != 0)) {
    if ((state.relaxngschemas != (xmlRelaxNGPtr)0x0) && (state.canonical_11 == 0)) {
      if (state.progresult != XMLLINT_RETURN_OK) {
        startTimer((xmllintState *)&lint);
      }
      lVar4 = xmlSchemaNewParserCtxt(state.relaxngschemas);
      if (lVar4 == 0) {
        state.testIO = 9;
        iVar1 = state.testIO;
        goto LAB_00106a85;
      }
      xmlSchemaSetResourceLoader(lVar4,xmllintResourceLoader,(xmllintState *)&lint);
      state.schema = (char *)xmlSchemaParse(lVar4);
      if (state.schema == (char *)0x0) {
        fprintf((FILE *)errStream,"WXS schema %s failed to compile\n",state.relaxngschemas);
        state.testIO = 5;
        iVar1 = state.testIO;
        goto LAB_00106a85;
      }
      xmlSchemaFreeParserCtxt(lVar4);
      if (state.progresult != XMLLINT_RETURN_OK) {
        endTimer((xmllintState *)&lint,"Compiling the schemas");
      }
    }
  }
  else {
    state.catalogs = state.catalogs | 4;
    if (state.progresult != XMLLINT_RETURN_OK) {
      startTimer((xmllintState *)&lint);
    }
    lVar4 = xmlRelaxNGNewParserCtxt(state._112_8_);
    if (lVar4 == 0) {
      state.testIO = 9;
      iVar1 = state.testIO;
      goto LAB_00106a85;
    }
    xmlRelaxNGSetResourceLoader(lVar4,xmllintResourceLoader,(xmllintState *)&lint);
    state.relaxng = (char *)xmlRelaxNGParse(lVar4);
    if (state.relaxng == (char *)0x0) {
      fprintf((FILE *)errStream,"Relax-NG schema %s failed to compile\n",state._112_8_);
      state.testIO = 5;
      iVar1 = state.testIO;
      goto LAB_00106a85;
    }
    xmlRelaxNGFreeParserCtxt(lVar4);
    if (state.progresult != XMLLINT_RETURN_OK) {
      endTimer((xmllintState *)&lint,"Compiling the schemas");
    }
  }
  if (((state._248_8_ == 0) || (state.exc_canonical != 0)) ||
     (iVar1 = xmlPatternCompileSafe(state._248_8_,0,0,0,&state.pattern),
     state.pattern != (char *)0x0)) {
    for (res = 1; res < argc; res = res + 1) {
      pcVar2 = argv[res];
      info.__glibc_reserved[2]._4_4_ = -1;
      if ((*pcVar2 == '-') && (iVar1 = strcmp(pcVar2,"-"), iVar1 != 0)) {
        iVar1 = skipArgs(pcVar2);
        res = iVar1 + res;
      }
      else {
        if (state.htmlout != 0) {
          iVar1 = stat64(pcVar2,(stat64 *)&ctxt_3);
          if (iVar1 < 0) {
            state.testIO = 4;
            break;
          }
          info.__glibc_reserved[2]._4_4_ = open64(pcVar2,0);
          if (info.__glibc_reserved[2]._4_4_ < 0) {
            state.testIO = 4;
            break;
          }
          state._184_8_ = mmap64((void *)0x0,info.st_rdev + 1,1,1,info.__glibc_reserved[2]._4_4_,0);
          if ((void *)state._184_8_ == (void *)0xffffffffffffffff) {
            close(info.__glibc_reserved[2]._4_4_);
            fprintf((FILE *)errStream,"mmap failure for file %s\n",pcVar2);
            state.testIO = 4;
            break;
          }
          state.memoryData = (char *)info.st_rdev;
        }
        if ((state.progresult != XMLLINT_RETURN_OK) && (1 < (int)(uint)state.wxschematron)) {
          startTimer((xmllintState *)&lint);
        }
        if (state.canonical_11 == 0) {
          if (state.wxschematron._4_4_ == 0) {
            if (state.xmlout == 0) {
              handler = (xmlSAXHandler *)xmlNewParserCtxt();
            }
            else {
              handler = (xmlSAXHandler *)xmlCreatePushParserCtxt(0,0,0,0,pcVar2);
              xmlCtxtUseOptions(handler,state.catalogs);
            }
          }
          else if (state.xmlout == 0) {
            handler = (xmlSAXHandler *)htmlNewParserCtxt();
          }
          else {
            handler = (xmlSAXHandler *)htmlCreatePushParserCtxt(0,0,0,0,pcVar2);
            htmlCtxtUseOptions(handler,state.catalogs);
          }
          if (handler == (xmlSAXHandler *)0x0) {
            state.testIO = 9;
            iVar1 = state.testIO;
            goto LAB_00106a85;
          }
          if (state.maxmem != 0) {
            if (state.debug == 0) {
              if ((state.catalogs & 0x200U) == 0) {
                local_488 = &debugSAX2Handler;
              }
              else {
                local_488 = &debugSAXHandler;
              }
            }
            else {
              local_488 = &emptySAXHandler;
            }
            memcpy(handler->internalSubset,local_488,0x100);
            handler->isStandalone = (isStandaloneSAXFunc)&lint;
          }
          xmlCtxtSetResourceLoader(handler,xmllintResourceLoader,(xmllintState *)&lint);
          if (state.nocatalogs != 0) {
            xmlCtxtSetMaxAmplification(handler,state.nocatalogs);
          }
          if (state.html != 0) {
            handler[1].warning = (warningSAXFunc)&lint;
            xmlCtxtSetErrorHandler(handler,xmlHTMLError,handler);
          }
          state.errStream = (FILE *)handler;
          for (files = 0; files < (int)(uint)state.wxschematron; files = files + 1) {
            if ((state.xmlout != 0) && (0 < files)) {
              xmlCtxtResetPush(handler,0,0,0);
            }
            if (state.maxmem == 0) {
              parseAndPrintFile((xmllintState *)&lint,pcVar2);
            }
            else {
              testSAX((xmllintState *)&lint,pcVar2);
            }
          }
          xmlFreeParserCtxt(handler);
        }
        else {
          for (files = 0; files < (int)(uint)state.wxschematron; files = files + 1) {
            streamFile((xmllintState *)&lint,pcVar2);
          }
        }
        if ((state.progresult != XMLLINT_RETURN_OK) && (1 < (int)(uint)state.wxschematron)) {
          endTimer((xmllintState *)&lint,"%d iterations",(ulong)(uint)state.wxschematron);
        }
        catal._0_4_ = (int)catal + 1;
        if (state.htmlout != 0) {
          munmap((void *)state._184_8_,(size_t)state.memoryData);
          close(info.__glibc_reserved[2]._4_4_);
        }
      }
    }
    if (state.quiet != 0) {
      parseAndPrintFile((xmllintState *)&lint,(char *)0x0);
    }
    if ((state.html != 0) && (state.version == 0)) {
      fprintf((FILE *)errStream,"</body></html>\n");
    }
    iVar1 = state.testIO;
    if ((((int)catal == 0) && (state.quiet == 0)) && ((int)state.defaultResourceLoader == 0)) {
      usage(errStream,*argv);
      state.testIO = 1;
      iVar1 = state.testIO;
    }
  }
  else if (iVar1 < 0) {
    state.testIO = 9;
    iVar1 = state.testIO;
  }
  else {
    fprintf((FILE *)errStream,"Pattern %s failed to compile\n",state._248_8_);
    state.testIO = 7;
    iVar1 = state.testIO;
  }
LAB_00106a85:
  state.testIO = iVar1;
  if (state.html != 0) {
    (*_xmlFree)(state._824_8_);
  }
  if (state.schematron != (char *)0x0) {
    xmlSchematronFree(state.schematron);
  }
  if (state.relaxng != (char *)0x0) {
    xmlRelaxNGFree(state.relaxng);
  }
  if (state.schema != (char *)0x0) {
    xmlSchemaFree(state.schema);
  }
  if (state.pattern != (char *)0x0) {
    xmlFreePattern(state.pattern);
  }
  xmlCleanupParser();
  if ((state.defaultResourceLoader._4_4_ == 0) || (xmllintMaxmemReached == 0)) {
    if (state.testIO == 9) {
      fprintf((FILE *)errStream,"Out-of-memory error reported\n");
    }
  }
  else {
    fprintf((FILE *)errStream,"Maximum memory exceeded (%d bytes)\n",(ulong)(uint)xmllintMaxmem);
  }
  return state.testIO;
}

Assistant:

int
xmllintMain(int argc, const char **argv, FILE *errStream,
            xmlResourceLoader loader) {
    xmllintState state, *lint;
    int i, j, res;
    int files = 0;

#ifdef _WIN32
    _setmode(_fileno(stdin), _O_BINARY);
    _setmode(_fileno(stdout), _O_BINARY);
    _setmode(_fileno(stderr), _O_BINARY);
#endif

    lint = &state;
    xmllintInit(lint);
    lint->errStream = errStream;
    lint->defaultResourceLoader = loader;

    res = xmllintParseOptions(lint, argc, argv);
    if (res != XMLLINT_RETURN_OK) {
        lint->progresult = res;
        goto error;
    }

    if (lint->maxmem != 0) {
        xmllintMaxmem = 0;
        xmllintMaxmemReached = 0;
        xmllintOom = 0;
        xmlMemSetup(myFreeFunc, myMallocFunc, myReallocFunc, myStrdupFunc);
    }

    LIBXML_TEST_VERSION

#ifdef LIBXML_CATALOG_ENABLED
    if (lint->nocatalogs == 0) {
	if (lint->catalogs) {
	    const char *catal;

	    catal = getenv("SGML_CATALOG_FILES");
	    if (catal != NULL) {
		xmlLoadCatalogs(catal);
	    } else {
		fprintf(errStream, "Variable $SGML_CATALOG_FILES not set\n");
	    }
	}
    }
#endif

#ifdef LIBXML_OUTPUT_ENABLED
    {
        const char *indent = getenv("XMLLINT_INDENT");
        if (indent != NULL) {
            xmlTreeIndentString = indent;
        }
    }
#endif

    if (lint->htmlout) {
        lint->htmlBuf = xmlMalloc(HTML_BUF_SIZE);
        if (lint->htmlBuf == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }

        if (!lint->nowrap) {
            fprintf(errStream,
             "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\"\n");
            fprintf(errStream,
                    "\t\"http://www.w3.org/TR/REC-html40/loose.dtd\">\n");
            fprintf(errStream,
             "<html><head><title>%s output</title></head>\n",
                    argv[0]);
            fprintf(errStream,
             "<body bgcolor=\"#ffffff\"><h1 align=\"center\">%s output</h1>\n",
                    argv[0]);
        }
    }

#ifdef LIBXML_SCHEMATRON_ENABLED
    if ((lint->schematron != NULL) && (lint->sax == 0)
#ifdef LIBXML_READER_ENABLED
        && (lint->stream == 0)
#endif /* LIBXML_READER_ENABLED */
	) {
	xmlSchematronParserCtxtPtr ctxt;

        /* forces loading the DTDs */
	lint->options |= XML_PARSE_DTDLOAD;
	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlSchematronNewParserCtxt(lint->schematron);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
	lint->wxschematron = xmlSchematronParse(ctxt);
	if (lint->wxschematron == NULL) {
	    fprintf(errStream, "Schematron schema %s failed to compile\n",
                    lint->schematron);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlSchematronFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    }
#endif

#ifdef LIBXML_SCHEMAS_ENABLED
    if ((lint->relaxng != NULL) && (lint->sax == 0)
#ifdef LIBXML_READER_ENABLED
        && (lint->stream == 0)
#endif /* LIBXML_READER_ENABLED */
	) {
	xmlRelaxNGParserCtxtPtr ctxt;

        /* forces loading the DTDs */
	lint->options |= XML_PARSE_DTDLOAD;
	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlRelaxNGNewParserCtxt(lint->relaxng);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
        xmlRelaxNGSetResourceLoader(ctxt, xmllintResourceLoader, lint);
	lint->relaxngschemas = xmlRelaxNGParse(ctxt);
	if (lint->relaxngschemas == NULL) {
	    fprintf(errStream, "Relax-NG schema %s failed to compile\n",
                    lint->relaxng);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlRelaxNGFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    } else if ((lint->schema != NULL)
#ifdef LIBXML_READER_ENABLED
		&& (lint->stream == 0)
#endif
	) {
	xmlSchemaParserCtxtPtr ctxt;

	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlSchemaNewParserCtxt(lint->schema);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
        xmlSchemaSetResourceLoader(ctxt, xmllintResourceLoader, lint);
	lint->wxschemas = xmlSchemaParse(ctxt);
	if (lint->wxschemas == NULL) {
	    fprintf(errStream, "WXS schema %s failed to compile\n",
                    lint->schema);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlSchemaFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    }
#endif /* LIBXML_SCHEMAS_ENABLED */

#if defined(LIBXML_READER_ENABLED) && defined(LIBXML_PATTERN_ENABLED)
    if ((lint->pattern != NULL) && (lint->walker == 0)) {
        res = xmlPatternCompileSafe(BAD_CAST lint->pattern, NULL, 0, NULL,
                                    &lint->patternc);
	if (lint->patternc == NULL) {
            if (res < 0) {
                lint->progresult = XMLLINT_ERR_MEM;
            } else {
                fprintf(errStream, "Pattern %s failed to compile\n",
                        lint->pattern);
                lint->progresult = XMLLINT_ERR_SCHEMAPAT;
            }
            goto error;
	}
    }
#endif /* LIBXML_READER_ENABLED && LIBXML_PATTERN_ENABLED */

    /*
     * The main loop over input documents
     */
    for (i = 1; i < argc ; i++) {
        const char *filename = argv[i];
#if HAVE_DECL_MMAP
        int memoryFd = -1;
#endif

	if ((filename[0] == '-') && (strcmp(filename, "-") != 0)) {
            i += skipArgs(filename);
            continue;
        }

#if HAVE_DECL_MMAP
        if (lint->memory) {
            struct stat info;
            if (stat(filename, &info) < 0) {
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            memoryFd = open(filename, O_RDONLY);
            if (memoryFd < 0) {
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            lint->memoryData = mmap(NULL, info.st_size + 1, PROT_READ,
                                    MAP_SHARED, memoryFd, 0);
            if (lint->memoryData == (void *) MAP_FAILED) {
                close(memoryFd);
                fprintf(errStream, "mmap failure for file %s\n", filename);
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            lint->memorySize = info.st_size;
        }
#endif /* HAVE_DECL_MMAP */

	if ((lint->timing) && (lint->repeat > 1))
	    startTimer(lint);

#ifdef LIBXML_READER_ENABLED
        if (lint->stream != 0) {
            for (j = 0; j < lint->repeat; j++)
                streamFile(lint, filename);
        } else
#endif /* LIBXML_READER_ENABLED */
        {
            xmlParserCtxtPtr ctxt;

#ifdef LIBXML_HTML_ENABLED
            if (lint->html) {
#ifdef LIBXML_PUSH_ENABLED
                if (lint->push) {
                    ctxt = htmlCreatePushParserCtxt(NULL, NULL, NULL, 0,
                                                    filename,
                                                    XML_CHAR_ENCODING_NONE);
                    htmlCtxtUseOptions(ctxt, lint->options);
                } else
#endif /* LIBXML_PUSH_ENABLED */
                {
                    ctxt = htmlNewParserCtxt();
                }
            } else
#endif /* LIBXML_HTML_ENABLED */
            {
#ifdef LIBXML_PUSH_ENABLED
                if (lint->push) {
                    ctxt = xmlCreatePushParserCtxt(NULL, NULL, NULL, 0,
                                                   filename);
                    xmlCtxtUseOptions(ctxt, lint->options);
                } else
#endif /* LIBXML_PUSH_ENABLED */
                {
                    ctxt = xmlNewParserCtxt();
                }
            }
            if (ctxt == NULL) {
                lint->progresult = XMLLINT_ERR_MEM;
                goto error;
            }

            if (lint->sax) {
                const xmlSAXHandler *handler;

                if (lint->noout) {
                    handler = &emptySAXHandler;
#ifdef LIBXML_SAX1_ENABLED
                } else if (lint->options & XML_PARSE_SAX1) {
                    handler = &debugSAXHandler;
#endif
                } else {
                    handler = &debugSAX2Handler;
                }

                *ctxt->sax = *handler;
                ctxt->userData = lint;
            }

            xmlCtxtSetResourceLoader(ctxt, xmllintResourceLoader, lint);
            if (lint->maxAmpl > 0)
                xmlCtxtSetMaxAmplification(ctxt, lint->maxAmpl);

            if (lint->htmlout) {
                ctxt->_private = lint;
                xmlCtxtSetErrorHandler(ctxt, xmlHTMLError, ctxt);
            }

            lint->ctxt = ctxt;

            for (j = 0; j < lint->repeat; j++) {
#ifdef LIBXML_PUSH_ENABLED
                if ((lint->push) && (j > 0))
                    xmlCtxtResetPush(ctxt, NULL, 0, NULL, NULL);
#endif
                if (lint->sax) {
                    testSAX(lint, filename);
                } else {
                    parseAndPrintFile(lint, filename);
                }
            }

            xmlFreeParserCtxt(ctxt);
        }

        if ((lint->timing) && (lint->repeat > 1)) {
            endTimer(lint, "%d iterations", lint->repeat);
        }

        files += 1;

#if HAVE_DECL_MMAP
        if (lint->memory) {
            munmap(lint->memoryData, lint->memorySize);
            close(memoryFd);
        }
#endif
    }

    if (lint->generate)
	parseAndPrintFile(lint, NULL);

    if ((lint->htmlout) && (!lint->nowrap)) {
	fprintf(errStream, "</body></html>\n");
    }

    if ((files == 0) && (!lint->generate) && (lint->version == 0)) {
	usage(errStream, argv[0]);
        lint->progresult = XMLLINT_ERR_UNCLASS;
    }

error:

    if (lint->htmlout)
        xmlFree(lint->htmlBuf);

#ifdef LIBXML_SCHEMATRON_ENABLED
    if (lint->wxschematron != NULL)
	xmlSchematronFree(lint->wxschematron);
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    if (lint->relaxngschemas != NULL)
	xmlRelaxNGFree(lint->relaxngschemas);
    if (lint->wxschemas != NULL)
	xmlSchemaFree(lint->wxschemas);
#endif
#if defined(LIBXML_READER_ENABLED) && defined(LIBXML_PATTERN_ENABLED)
    if (lint->patternc != NULL)
        xmlFreePattern(lint->patternc);
#endif

    xmlCleanupParser();

    if ((lint->maxmem) && (xmllintMaxmemReached)) {
        fprintf(errStream, "Maximum memory exceeded (%d bytes)\n",
                xmllintMaxmem);
    } else if (lint->progresult == XMLLINT_ERR_MEM) {
        fprintf(errStream, "Out-of-memory error reported\n");
    }

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if ((lint->maxmem) &&
        (xmllintOom != (lint->progresult == XMLLINT_ERR_MEM))) {
        fprintf(stderr, "xmllint: malloc failure %s reported\n",
                xmllintOom ? "not" : "erroneously");
        abort();
    }
#endif

    return(lint->progresult);
}